

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O3

cmCMakePath * __thiscall
cmCMakePath::GetNarrowStem(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [16];
  string stem;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string_type local_60;
  path local_40;
  
  auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar3._8_8_ == 0 || auVar3._0_8_ == 0) {
    std::filesystem::__cxx11::path::path(&local_40);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,auVar3._0_8_);
    std::filesystem::__cxx11::path::path(&local_40,&local_60,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,local_40._M_pathname._M_dataplus._M_p,
             local_40._M_pathname._M_dataplus._M_p + local_40._M_pathname._M_string_length);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (local_b8 != 0) {
    lVar1 = std::__cxx11::string::find((char)&local_c0,0x2e);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_c0);
      cmCMakePath<std::__cxx11::string,cmCMakePath&>
                (__return_storage_ptr__,&local_80,generic_format);
      paVar2 = &local_80.field_2;
      goto LAB_002e2652;
    }
  }
  paVar2 = &local_a0.field_2;
  if (local_c0 == &local_b0) {
    local_a0.field_2._8_8_ = local_b0._8_8_;
    local_a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)local_c0;
  }
  local_a0._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_c0 = &local_b0;
  cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&local_a0,generic_format);
  local_80._M_dataplus._M_p = local_a0._M_dataplus._M_p;
LAB_002e2652:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,paVar2->_M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetNarrowStem() const
{
  auto stem = this->Path.stem().string();
  if (!stem.empty()) {
    auto pos = stem.find('.', stem[0] == '.' ? 1 : 0);
    if (pos != std::string::npos) {
      return stem.substr(0, pos);
    }
  }
  return stem;
}